

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.c
# Opt level: O1

csafestring_t * filemanager_calculateCompilationPath(ctemplate_t *ctemplate,char *templateFile)

{
  char *__s;
  csafestring_t *obj;
  char *pcVar1;
  char *pcVar2;
  
  obj = safe_clone(ctemplate->workingBaseDir);
  safe_strcat(obj,templateFile);
  __s = obj->data;
  pcVar1 = strrchr(__s,0x2e);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = __s;
  }
  pcVar2[0] = 's';
  pcVar2[1] = 'o';
  pcVar2[2] = '\0';
  return obj;
}

Assistant:

csafestring_t *filemanager_calculateCompilationPath(ctemplate_t *ctemplate, char *templateFile) {
	csafestring_t *compilationPath = safe_clone(ctemplate->workingBaseDir);
	safe_strcat(compilationPath, templateFile);

	char *suffix = filemanager_getSuffix(compilationPath->data);
	*suffix = 's';
	*( suffix + 1 ) = 'o';
	*( suffix + 2 ) = '\0';

	return compilationPath;
}